

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloat4Color
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  ostringstream *this_00;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  StateQueryMemoryWriteGuard<int[4]> floatVector4;
  Hex<8UL> local_210;
  TestContext *local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  StateQueryMemoryWriteGuard<int[4]> local_1e8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  lVar4 = (long)((reference0 * 4.2949673e+09 + -1.0) * 0.5);
  uVar7 = lVar4 - 0x3ff;
  if (0x7ffffffe < (long)uVar7) {
    uVar7 = 0x7fffffff;
  }
  if ((long)uVar7 < -0x7fffffff) {
    uVar7 = 0xffffffff80000000;
  }
  lVar2 = (long)((reference1 * 4.2949673e+09 + -1.0) * 0.5);
  local_1f0 = lVar2 - 0x3ff;
  if (0x7ffffffe < (long)local_1f0) {
    local_1f0 = 0x7fffffff;
  }
  if ((long)local_1f0 < -0x7fffffff) {
    local_1f0 = 0xffffffff80000000;
  }
  lVar8 = (long)((reference2 * 4.2949673e+09 + -1.0) * 0.5);
  local_1f8 = lVar8 - 0x3ff;
  if (0x7ffffffe < (long)local_1f8) {
    local_1f8 = 0x7fffffff;
  }
  if ((long)local_1f8 < -0x7fffffff) {
    local_1f8 = 0xffffffff80000000;
  }
  lVar6 = (long)((reference3 * 4.2949673e+09 + -1.0) * 0.5);
  uVar10 = lVar6 - 0x3ff;
  if (0x7ffffffe < (long)uVar10) {
    uVar10 = 0x7fffffff;
  }
  if ((long)uVar10 < -0x7fffffff) {
    uVar10 = 0xffffffff80000000;
  }
  uVar5 = lVar4 + 0x3ff;
  if (0x7ffffffe < (long)uVar5) {
    uVar5 = 0x7fffffff;
  }
  if ((long)uVar5 < -0x7fffffff) {
    uVar5 = 0xffffffff80000000;
  }
  uVar3 = lVar2 + 0x3ff;
  if (0x7ffffffe < (long)uVar3) {
    uVar3 = 0x7fffffff;
  }
  if ((long)uVar3 < -0x7fffffff) {
    uVar3 = 0xffffffff80000000;
  }
  uVar9 = lVar8 + 0x3ff;
  if (0x7ffffffe < (long)uVar9) {
    uVar9 = 0x7fffffff;
  }
  if ((long)uVar9 < -0x7fffffff) {
    uVar9 = 0xffffffff80000000;
  }
  local_200 = lVar6 + 0x3ff;
  if (0x7ffffffe < (long)local_200) {
    local_200 = 0x7fffffff;
  }
  if ((long)local_200 < -0x7fffffff) {
    local_200 = 0xffffffff80000000;
  }
  local_1e8.m_postguard[0] = -0x21212122;
  local_1e8.m_postguard[1] = -0x21212122;
  local_1e8.m_postguard[2] = -0x21212122;
  local_1e8.m_postguard[3] = -0x21212122;
  local_1e8.m_value[0] = -0x21212122;
  local_1e8.m_value[1] = -0x21212122;
  local_1e8.m_value[2] = -0x21212122;
  local_1e8.m_value[3] = -0x21212122;
  local_1e8.m_preguard[0] = -0x21212122;
  local_1e8.m_preguard[1] = -0x21212122;
  local_1e8.m_preguard[2] = -0x21212122;
  local_1e8.m_preguard[3] = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1e8.m_value);
  local_208 = testCtx;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    (&local_1e8,testCtx);
  if (bVar1) {
    if (((((int)uVar5 < local_1e8.m_value[0] || local_1e8.m_value[0] < (int)uVar7) ||
         ((int)uVar3 < local_1e8.m_value[1] || local_1e8.m_value[1] < (int)local_1f0)) ||
        ((int)uVar9 < local_1e8.m_value[2] || local_1e8.m_value[2] < (int)local_1f8)) ||
       ((int)local_200 < local_1e8.m_value[3] || local_1e8.m_value[3] < (int)uVar10)) {
      local_1b0._0_8_ = local_208->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected in ranges ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_210.value = uVar7 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_210.value = uVar5 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_210.value = local_1f0 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_210.value = uVar3 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_210.value = local_1f8 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_210.value = uVar9 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[",1);
      local_210.value = uVar10 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      local_210.value = local_200 & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
      local_210.value = local_1e8.m_value._0_8_ & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_210.value = (ulong)local_1e8.m_value._0_8_ >> 0x20;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_210.value = local_1e8.m_value._8_8_ & 0xffffffff;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      local_210.value = (ulong)local_1e8.m_value._8_8_ >> 0x20;
      tcu::Format::Hex<8UL>::toStream(&local_210,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      if (local_208->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(local_208,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

GLint64 expandGLFloatToInteger (GLfloat f)
{
	const GLuint64 referenceValue = (GLint64)((f * double(0xFFFFFFFFULL) - 1) / 2);
	return referenceValue;
}